

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5GetVarint32(uchar *p,u32 *v)

{
  byte bVar1;
  uint in_EAX;
  uint uVar2;
  u64 v64;
  uint local_18 [2];
  
  uVar2 = (uint)*p;
  if ((char)*p < '\0') {
    bVar1 = p[1];
    if ((char)bVar1 < '\0') {
      if ((char)p[2] < '\0') {
        local_18[0] = in_EAX;
        bVar1 = sqlite3Fts5GetVarint(p,(u64 *)local_18);
        *v = local_18[0] & 0x7fffffff;
        uVar2 = (uint)bVar1;
      }
      else {
        *v = (bVar1 & 0x7f) << 7 | (uVar2 & 0x7f) << 0xe | (int)(char)p[2];
        uVar2 = 3;
      }
    }
    else {
      *v = (uVar2 & 0x7f) << 7 | (uint)bVar1;
      uVar2 = 2;
    }
  }
  else {
    *v = uVar2;
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

static int sqlite3Fts5GetVarint32(const unsigned char *p, u32 *v){
  u32 a,b;

  /* The 1-byte case. Overwhelmingly the most common. */
  a = *p;
  /* a: p0 (unmasked) */
  if (!(a&0x80))
  {
    /* Values between 0 and 127 */
    *v = a;
    return 1;
  }

  /* The 2-byte case */
  p++;
  b = *p;
  /* b: p1 (unmasked) */
  if (!(b&0x80))
  {
    /* Values between 128 and 16383 */
    a &= 0x7f;
    a = a<<7;
    *v = a | b;
    return 2;
  }

  /* The 3-byte case */
  p++;
  a = a<<14;
  a |= *p;
  /* a: p0<<14 | p2 (unmasked) */
  if (!(a&0x80))
  {
    /* Values between 16384 and 2097151 */
    a &= (0x7f<<14)|(0x7f);
    b &= 0x7f;
    b = b<<7;
    *v = a | b;
    return 3;
  }

  /* A 32-bit varint is used to store size information in btrees.
  ** Objects are rarely larger than 2MiB limit of a 3-byte varint.
  ** A 3-byte varint is sufficient, for example, to record the size
  ** of a 1048569-byte BLOB or string.
  **
  ** We only unroll the first 1-, 2-, and 3- byte cases.  The very
  ** rare larger cases can be handled by the slower 64-bit varint
  ** routine.
  */
  {
    u64 v64;
    u8 n;
    p -= 2;
    n = sqlite3Fts5GetVarint(p, &v64);
    *v = ((u32)v64) & 0x7FFFFFFF;
    assert( n>3 && n<=9 );
    return n;
  }
}